

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O2

int glslang::TIntermediate::getOffset(TType *type,int index)

{
  int iVar1;
  TTypeList *pTVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  long lVar4;
  int m;
  long lVar5;
  int offset;
  int memberSize;
  int local_38 [2];
  
  pTVar2 = TType::getStruct(type);
  lVar4 = (long)index;
  iVar1 = (*((pTVar2->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
             super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar4].type)->_vptr_TType[10])();
  if (*(int *)(CONCAT44(extraout_var,iVar1) + 0x14) == -1) {
    local_38[0] = 0;
    local_38[1] = 0;
    lVar3 = 0;
    for (lVar5 = 0; lVar5 <= lVar4; lVar5 = lVar5 + 1) {
      updateOffset(type,*(TType **)
                         ((long)&((pTVar2->
                                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                  ).
                                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->type + lVar3),local_38
                   ,local_38 + 1);
      if (lVar5 < lVar4) {
        local_38[0] = local_38[0] + local_38[1];
      }
      lVar3 = lVar3 + 0x20;
    }
  }
  else {
    iVar1 = (*((pTVar2->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
               ).super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar4].type)->_vptr_TType[10])();
    local_38[0] = *(int *)(CONCAT44(extraout_var_00,iVar1) + 0x14);
  }
  return local_38[0];
}

Assistant:

int TIntermediate::getOffset(const TType& type, int index)
{
    const TTypeList& memberList = *type.getStruct();

    // Don't calculate offset if one is present, it could be user supplied
    // and different than what would be calculated.  That is, this is faster,
    // but not just an optimization.
    if (memberList[index].type->getQualifier().hasOffset())
        return memberList[index].type->getQualifier().layoutOffset;

    int memberSize = 0;
    int offset = 0;
    for (int m = 0; m <= index; ++m) {
        updateOffset(type, *memberList[m].type, offset, memberSize);

        if (m < index)
            offset += memberSize;
    }

    return offset;
}